

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

CPAccessResult access_tdra(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  CPAccessResult CVar2;
  uint64_t uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar4 = env->uncached_cpsr & 0x1f;
      if (uVar4 == 0x10) {
        uVar4 = 0;
      }
      else if (uVar4 == 0x16) {
        uVar4 = 3;
      }
      else if (uVar4 == 0x1a) {
        uVar4 = 2;
      }
      else {
        if ((uVar1 >> 0x21 & 1) != 0) {
          bVar5 = uVar4 == 0x16;
          if (!bVar5) {
            bVar5 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if ((((uint)uVar1 >> 0x1c & 1) == 0) && (uVar4 = 3, bVar5)) goto LAB_0061f7fd;
        }
        uVar4 = 1;
      }
    }
    else {
      uVar4 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar4 = 1;
    if ((env->v7m).exception == 0) {
      uVar4 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061f7fd:
  if (((env->cp15).mdcr_el2 & 0x900) == 0) {
    uVar3 = arm_hcr_el2_eff_aarch64(env);
    bVar5 = ((uint)uVar3 >> 0x1b & 1) == 0;
  }
  else {
    bVar5 = false;
  }
  if ((((1 < uVar4) || (bVar5)) ||
      ((CVar2 = CP_ACCESS_TRAP_EL2, (uVar1 >> 0x21 & 1) != 0 && (((env->cp15).scr_el3 & 1) == 0))))
     && ((2 < uVar4 || (CVar2 = CP_ACCESS_TRAP_EL3, ((env->cp15).mdcr_el3 & 0x200) == 0)))) {
    CVar2 = CP_ACCESS_OK;
  }
  return CVar2;
}

Assistant:

static CPAccessResult access_tdra(CPUARMState *env, const ARMCPRegInfo *ri,
                                  bool isread)
{
    int el = arm_current_el(env);
    bool mdcr_el2_tdra = (env->cp15.mdcr_el2 & MDCR_TDRA) ||
        (env->cp15.mdcr_el2 & MDCR_TDE) ||
        (arm_hcr_el2_eff(env) & HCR_TGE);

    if (el < 2 && mdcr_el2_tdra && !arm_is_secure_below_el3(env)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 && (env->cp15.mdcr_el3 & MDCR_TDA)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}